

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_array.c
# Opt level: O0

int main(void)

{
  int iVar1;
  
  memset(item,0,0x40);
  UnityBegin(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/deps/cJSON/tests/parse_array.c"
            );
  UnityDefaultTestRun(parse_array_should_parse_empty_arrays,"parse_array_should_parse_empty_arrays",
                      0xa2);
  UnityDefaultTestRun(parse_array_should_parse_arrays_with_one_element,
                      "parse_array_should_parse_arrays_with_one_element",0xa3);
  UnityDefaultTestRun(parse_array_should_parse_arrays_with_multiple_elements,
                      "parse_array_should_parse_arrays_with_multiple_elements",0xa4);
  UnityDefaultTestRun(parse_array_should_not_parse_non_arrays,
                      "parse_array_should_not_parse_non_arrays",0xa5);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

main(void)
{
    /* initialize cJSON item */
    memset(item, 0, sizeof(cJSON));

    UNITY_BEGIN();
    RUN_TEST(parse_array_should_parse_empty_arrays);
    RUN_TEST(parse_array_should_parse_arrays_with_one_element);
    RUN_TEST(parse_array_should_parse_arrays_with_multiple_elements);
    RUN_TEST(parse_array_should_not_parse_non_arrays);
    return UNITY_END();
}